

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void decorated_win_size(Fl_Window *win,int *w,int *h)

{
  Display *pDVar1;
  int iVar2;
  uint uVar3;
  Fl_Group *pFVar4;
  Fl_X *pFVar5;
  undefined1 local_c8 [8];
  XWindowAttributes attributes;
  int status;
  uint n;
  Window *children;
  Window parent;
  Window root;
  int *h_local;
  int *w_local;
  Fl_Window *win_local;
  
  root = (Window)h;
  h_local = w;
  w_local = (int *)win;
  iVar2 = Fl_Widget::w((Fl_Widget *)win);
  *h_local = iVar2;
  iVar2 = Fl_Widget::h((Fl_Widget *)w_local);
  *(int *)root = iVar2;
  iVar2 = Fl_Window::shown((Fl_Window *)w_local);
  if ((((iVar2 != 0) &&
       (pFVar4 = Fl_Widget::parent((Fl_Widget *)w_local), pFVar4 == (Fl_Group *)0x0)) &&
      (uVar3 = Fl_Window::border((Fl_Window *)w_local), uVar3 != 0)) &&
     (uVar3 = Fl_Widget::visible((Fl_Widget *)w_local), pDVar1 = fl_display, uVar3 != 0)) {
    attributes.screen._4_4_ = 0;
    pFVar5 = Fl_X::i((Fl_Window *)w_local);
    attributes.screen._0_4_ =
         XQueryTree(pDVar1,pFVar5->xid,&parent,&children,&status,
                    (undefined1 *)((long)&attributes.screen + 4));
    if (((int)attributes.screen != 0) && (attributes.screen._4_4_ != 0)) {
      XFree(_status);
    }
    if (((int)attributes.screen != 0) && ((Window *)parent != children)) {
      XGetWindowAttributes(fl_display,children,local_c8);
      *h_local = attributes.x;
      *(int *)root = attributes.y;
    }
  }
  return;
}

Assistant:

static void decorated_win_size(Fl_Window *win, int &w, int &h)
{
  w = win->w();
  h = win->h();
  if (!win->shown() || win->parent() || !win->border() || !win->visible()) return;
  Window root, parent, *children;
  unsigned n = 0;
  Status status = XQueryTree(fl_display, Fl_X::i(win)->xid, &root, &parent, &children, &n); 
  if (status != 0 && n) XFree(children);
  // when compiz is used, root and parent are the same window 
  // and I don't know where to find the window decoration
  if (status == 0 || root == parent) return; 
  XWindowAttributes attributes;
  XGetWindowAttributes(fl_display, parent, &attributes);
  w = attributes.width;
  h = attributes.height;
}